

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O0

bool __thiscall
crnlib::image_utils::error_metrics::compute
          (error_metrics *this,image_u8 *a,image_u8 *b,uint first_channel,uint num_channels,
          bool average_component_error)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  color_quad<unsigned_char,_int> *this_00;
  color_quad<unsigned_char,_int> *this_01;
  long lVar9;
  double dVar10;
  double local_880;
  double total_values;
  double x_1;
  double dStack_868;
  uint i;
  double sum2;
  double sum;
  uint c;
  color_quad_u8 *cb;
  color_quad_u8 *ca;
  uint x;
  uint y;
  double hist [256];
  uint height;
  uint width;
  bool average_component_error_local;
  uint num_channels_local;
  uint first_channel_local;
  image_u8 *b_local;
  image_u8 *a_local;
  error_metrics *this_local;
  
  uVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::get_width(a);
  uVar4 = image<crnlib::color_quad<unsigned_char,_int>_>::get_width(b);
  uVar5 = math::minimum<unsigned_int>(uVar3,uVar4);
  uVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::get_height(a);
  uVar4 = image<crnlib::color_quad<unsigned_char,_int>_>::get_height(b);
  hist[0xff]._4_4_ = math::minimum<unsigned_int>(uVar3,uVar4);
  utils::zero_object<double[256]>((double (*) [256])&x);
  for (ca._4_4_ = 0; ca._4_4_ < hist[0xff]._4_4_; ca._4_4_ = ca._4_4_ + 1) {
    for (ca._0_4_ = 0; (uint)ca < uVar5; ca._0_4_ = (uint)ca + 1) {
      this_00 = image<crnlib::color_quad<unsigned_char,_int>_>::operator()(a,(uint)ca,ca._4_4_);
      this_01 = image<crnlib::color_quad<unsigned_char,_int>_>::operator()(b,(uint)ca,ca._4_4_);
      if (num_channels == 0) {
        iVar6 = color_quad<unsigned_char,_int>::get_luma(this_00);
        iVar7 = color_quad<unsigned_char,_int>::get_luma(this_01);
        lVar9 = (long)(iVar6 - iVar7);
        if (lVar9 < 1) {
          lVar9 = -lVar9;
        }
        *(double *)(&x + lVar9 * 2) = *(double *)(&x + lVar9 * 2) + 1.0;
      }
      else {
        for (sum._4_4_ = 0; sum._4_4_ < num_channels; sum._4_4_ = sum._4_4_ + 1) {
          bVar1 = color_quad<unsigned_char,_int>::operator[](this_00,first_channel + sum._4_4_);
          bVar2 = color_quad<unsigned_char,_int>::operator[](this_01,first_channel + sum._4_4_);
          lVar9 = (long)(int)((uint)bVar1 - (uint)bVar2);
          if (lVar9 < 1) {
            lVar9 = -lVar9;
          }
          *(double *)(&x + lVar9 * 2) = *(double *)(&x + lVar9 * 2) + 1.0;
        }
      }
    }
  }
  this->mMax = 0;
  sum2 = 0.0;
  dStack_868 = 0.0;
  for (x_1._4_4_ = 0; x_1._4_4_ < 0x100; x_1._4_4_ = x_1._4_4_ + 1) {
    if ((*(double *)(&x + (ulong)x_1._4_4_ * 2) != 0.0) ||
       (NAN(*(double *)(&x + (ulong)x_1._4_4_ * 2)))) {
      uVar8 = math::maximum<unsigned_int>(this->mMax,x_1._4_4_);
      this->mMax = uVar8;
      dVar10 = (double)x_1._4_4_ * *(double *)(&x + (ulong)x_1._4_4_ * 2);
      sum2 = sum2 + dVar10;
      dStack_868 = (double)x_1._4_4_ * dVar10 + dStack_868;
    }
  }
  local_880 = (double)(uVar5 * hist[0xff]._4_4_);
  if (average_component_error) {
    uVar5 = math::clamp<unsigned_int>(num_channels,1,4);
    local_880 = (double)uVar5 * local_880;
  }
  dVar10 = math::clamp<double>(sum2 / local_880,0.0,255.0);
  this->mMean = dVar10;
  dVar10 = math::clamp<double>(dStack_868 / local_880,0.0,65025.0);
  this->mMeanSquared = dVar10;
  dVar10 = sqrt(this->mMeanSquared);
  this->mRootMeanSquared = dVar10;
  if ((this->mRootMeanSquared != 0.0) || (NAN(this->mRootMeanSquared))) {
    dVar10 = log10(255.0 / this->mRootMeanSquared);
    dVar10 = math::clamp<double>(dVar10 * 20.0,0.0,500.0);
    this->mPeakSNR = dVar10;
  }
  else {
    this->mPeakSNR = 999999.0;
  }
  return true;
}

Assistant:

bool error_metrics::compute(const image_u8& a, const image_u8& b, uint first_channel, uint num_channels, bool average_component_error)
        {
            //if ( (!a.get_width()) || (!b.get_height()) || (a.get_width() != b.get_width()) || (a.get_height() != b.get_height()) )
            //   return false;

            const uint width = math::minimum(a.get_width(), b.get_width());
            const uint height = math::minimum(a.get_height(), b.get_height());

            CRNLIB_ASSERT((first_channel < 4U) && (first_channel + num_channels <= 4U));

            // Histogram approach due to Charles Bloom.
            double hist[256];
            utils::zero_object(hist);

            for (uint y = 0; y < height; y++)
            {
                for (uint x = 0; x < width; x++)
                {
                    const color_quad_u8& ca = a(x, y);
                    const color_quad_u8& cb = b(x, y);

                    if (!num_channels)
                    {
                        hist[labs(ca.get_luma() - cb.get_luma())]++;
                    }
                    else
                    {
                        for (uint c = 0; c < num_channels; c++)
                        {
                            hist[labs(ca[first_channel + c] - cb[first_channel + c])]++;
                        }
                    }
                }
            }

            mMax = 0;
            double sum = 0.0f, sum2 = 0.0f;
            for (uint i = 0; i < 256; i++)
            {
                if (!hist[i])
                {
                    continue;
                }

                mMax = math::maximum(mMax, i);

                double x = i * hist[i];

                sum += x;
                sum2 += i * x;
            }

            // See http://bmrc.berkeley.edu/courseware/cs294/fall97/assignment/psnr.html
            double total_values = width * height;

            if (average_component_error)
            {
                total_values *= math::clamp<uint>(num_channels, 1, 4);
            }

            mMean = math::clamp<double>(sum / total_values, 0.0f, 255.0f);
            mMeanSquared = math::clamp<double>(sum2 / total_values, 0.0f, 255.0f * 255.0f);

            mRootMeanSquared = sqrt(mMeanSquared);

            if (!mRootMeanSquared)
            {
                mPeakSNR = cInfinitePSNR;
            }
            else
            {
                mPeakSNR = math::clamp<double>(log10(255.0f / mRootMeanSquared) * 20.0f, 0.0f, 500.0f);
            }

            return true;
        }